

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O0

json_string * NumberToString::_itoa<long>(json_string *__return_storage_ptr__,long val)

{
  char *pcVar1;
  char *pcVar2;
  allocator local_65 [20];
  allocator local_51;
  long local_50;
  long value;
  char *pcStack_40;
  bool negative;
  char *runner;
  char num_str_result [22];
  long val_local;
  
  num_str_result[0xd] = '\0';
  pcStack_40 = num_str_result + 0xc;
  value._7_1_ = val < 0;
  local_50 = val;
  if ((bool)value._7_1_) {
    local_50 = -val;
  }
  do {
    pcVar1 = pcStack_40;
    pcVar2 = pcStack_40 + -1;
    *pcStack_40 = (char)(local_50 % 10) + '0';
    local_50 = local_50 / 10;
    pcStack_40 = pcVar2;
  } while (local_50 != 0);
  if ((bool)value._7_1_) {
    *pcVar2 = '-';
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,local_65);
    std::allocator<char>::~allocator((allocator<char> *)local_65);
  }
  return __return_storage_ptr__;
}

Assistant:

static json_string _itoa(T val) json_nothrow {		
	   #ifdef JSON_LESS_MEMORY
		  json_auto<json_char> s(getLenSize<sizeof(T)>::GETLEN);
	   #else
		  json_char num_str_result[getLenSize<sizeof(T)>::GETLEN];
	   #endif
	   num_str_result[getLenSize<sizeof(T)>::GETLEN - 1] = JSON_TEXT('\0'); //null terminator
	   json_char * runner = &num_str_result[getLenSize<sizeof(T)>::GETLEN - 2];
	   bool negative;

	   START_MEM_SCOPE
	   long value = (long)val;
	   //first thing, check if it's negative, if so, make it positive
	   if (value < 0){
		  value = -value;
		  negative = true;
	   } else {
		  negative = false;
	   }

	   //create the string
	   do {
		  *runner-- = (json_char)(value % 10) + JSON_TEXT('0');
	   } while(value /= 10);
	   END_MEM_SCOPE

	   //if it's negative, add the negation
	   if (negative){
		  *runner = JSON_TEXT('-');
		  return json_string(runner);
	   }
	   return json_string(runner + 1);
    }